

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O1

BBox<3> * Omega_h::find_bounding_box<3>(BBox<3> *__return_storage_ptr__,Reals *coords)

{
  int *piVar1;
  Int i;
  int iVar2;
  ulong uVar3;
  long lVar4;
  BBox<3> init;
  Alloc *local_60;
  Alloc *local_50;
  undefined8 local_40 [6];
  
  local_60 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)local_60 & 1) == 0) {
    uVar3 = local_60->size;
  }
  else {
    uVar3 = (ulong)local_60 >> 3;
  }
  iVar2 = (int)(uVar3 >> 3);
  if (iVar2 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
    lVar4 = 0;
    do {
      local_40[lVar4] = 0x7fefffffffffffff;
      local_40[lVar4 + 3] = 0xffefffffffffffff;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60 = (Alloc *)(local_60->size * 8 + 1);
      }
      else {
        local_60->use_count = local_60->use_count + 1;
      }
    }
    local_50 = local_60;
    if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50 = (Alloc *)(local_60->size * 8 + 1);
      }
      else {
        local_60->use_count = local_60->use_count + 1;
      }
    }
    transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<3>,Omega_h::BBox<3>,Omega_h::UniteOp<3>>
              (__return_storage_ptr__,(Omega_h *)0x0,iVar2 / 3);
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      piVar1 = &local_50->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_50);
        operator_delete(local_50,0x48);
      }
    }
    if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
      piVar1 = &local_60->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_60);
        operator_delete(local_60,0x48);
      }
    }
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}